

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O2

AllocaInst * LLVMBC::dyn_cast<LLVMBC::AllocaInst>(Value *value)

{
  ValueKind VVar1;
  AllocaInst *this;
  AllocaInst *pAVar2;
  
  if (value != (Value *)0x0) {
    this = (AllocaInst *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)this);
    pAVar2 = (AllocaInst *)0x0;
    if (VVar1 == Alloca) {
      pAVar2 = this;
    }
    return pAVar2;
  }
  return (AllocaInst *)0x0;
}

Assistant:

inline T *dyn_cast(Value *value)
{
	if (!value)
		return nullptr;

	if (T::get_value_kind() != ValueKind::Proxy)
		value = Internal::resolve_proxy(value);

	if (T::is_base_of_value_kind(value->get_value_kind()))
		return static_cast<T *>(value);
	else
		return nullptr;
}